

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void * bc_trie_lookup(bc_trie_t *trie,char *key)

{
  char cVar1;
  _bc_trie_node_t *p_Var2;
  bc_trie_node_t *pbVar3;
  bool bVar4;
  
  if ((trie != (bc_trie_t *)0x0) &&
     (pbVar3 = trie->root, key != (char *)0x0 && pbVar3 != (bc_trie_node_t *)0x0)) {
    do {
      bVar4 = pbVar3 == (bc_trie_node_t *)0x0;
      if (!bVar4) {
        cVar1 = pbVar3->key;
        p_Var2 = pbVar3;
        while (cVar1 != *key) {
          p_Var2 = p_Var2->next;
          bVar4 = p_Var2 == (_bc_trie_node_t *)0x0;
          if (bVar4) goto LAB_0010a080;
          cVar1 = p_Var2->key;
        }
        if (cVar1 == '\0') {
          return p_Var2->data;
        }
        pbVar3 = p_Var2->child;
      }
LAB_0010a080:
    } while ((!bVar4) && (cVar1 = *key, key = key + 1, cVar1 != '\0'));
  }
  return (void *)0x0;
}

Assistant:

void*
bc_trie_lookup(bc_trie_t *trie, const char *key)
{
    if (trie == NULL || trie->root == NULL || key == NULL)
        return NULL;

    bc_trie_node_t *parent = trie->root;
    bc_trie_node_t *tmp;
    while (1) {
        for (tmp = parent; tmp != NULL; tmp = tmp->next) {

            if (tmp->key == *key) {
                if (tmp->key == '\0')
                    return tmp->data;
                parent = tmp->child;
                break;
            }
        }
        if (tmp == NULL)
            return NULL;

        if (*key == '\0')
            break;
        key++;
    }
    return NULL;
}